

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestRecursiveMessage::_InternalSerialize
          (TestRecursiveMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  TestRecursiveMessage *value;
  bool bVar2;
  int cached_size;
  int32_t value_00;
  uint32_t *puVar3;
  UnknownFieldSet *unknown_fields;
  uint32_t cached_has_bits;
  TestRecursiveMessage *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestRecursiveMessage *this_local;
  
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar3;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar1 & 1) != 0) {
    value = (this->field_0)._impl_.a_;
    cached_size = GetCachedSize((this->field_0)._impl_.a_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (1,(MessageLite *)value,cached_size,target,stream);
  }
  if ((uVar1 & 2) != 0) {
    value_00 = _internal_i(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>
                             (stream,value_00,(uint8_t *)stream_local);
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestRecursiveMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestRecursiveMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestRecursiveMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .proto2_unittest.TestRecursiveMessage a = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        1, *this_._impl_.a_, this_._impl_.a_->GetCachedSize(), target,
        stream);
  }

  // int32 i = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>(
            stream, this_._internal_i(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestRecursiveMessage)
  return target;
}